

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::DateTimePickerPrivate::findMovableSection(DateTimePickerPrivate *this,QPointF *pos)

{
  qsizetype qVar1;
  const_reference pSVar2;
  qreal qVar3;
  int local_24;
  int local_20;
  int i;
  int width;
  int x;
  QPointF *pos_local;
  DateTimePickerPrivate *this_local;
  
  qVar3 = QPointF::x(pos);
  local_20 = 0;
  local_24 = 0;
  while( true ) {
    qVar1 = QList<QtMWidgets::Section>::size(&(this->super_DateTimeParser).sections);
    if (qVar1 <= local_24) {
      this->movableSection = -1;
      return;
    }
    if ((local_20 <= (int)qVar3) &&
       (pSVar2 = QList<QtMWidgets::Section>::at
                           (&(this->super_DateTimeParser).sections,(long)local_24),
       (int)qVar3 < local_20 + pSVar2->sectionWidth)) break;
    pSVar2 = QList<QtMWidgets::Section>::at(&(this->super_DateTimeParser).sections,(long)local_24);
    local_20 = pSVar2->sectionWidth + local_20;
    local_24 = local_24 + 1;
  }
  this->movableSection = local_24;
  return;
}

Assistant:

void
DateTimePickerPrivate::findMovableSection( const QPointF & pos )
{
	const int x = pos.x();

	int width = 0;

	for( int i = 0; i < sections.size(); ++i )
	{
		if( x >= width && x < width + sections.at( i ).sectionWidth )
		{
			movableSection = i;
			return;
		}

		width += sections.at( i ).sectionWidth;
	}

	movableSection = -1;
}